

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isxdigit.c
# Opt level: O1

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar1 + 0x61) & 0x10) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1d,"isxdigit( \'0\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x73) & 0x10) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1e,"isxdigit( \'9\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xc3) & 0x10) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x1f,"isxdigit( \'a\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xcd) & 0x10) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x20,"isxdigit( \'f\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xcf) & 0x10) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x21,"! isxdigit( \'g\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x83) & 0x10) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x22,"isxdigit( \'A\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x8d) & 0x10) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x23,"isxdigit( \'F\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x8f) & 0x10) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x24,"! isxdigit( \'G\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x81) & 0x10) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x25,"! isxdigit( \'@\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x41) & 0x10) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isxdigit.c, line %d - %s\n"
           ,0x26,"! isxdigit( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isxdigit( '0' ) );
    TESTCASE( isxdigit( '9' ) );
    TESTCASE( isxdigit( 'a' ) );
    TESTCASE( isxdigit( 'f' ) );
    TESTCASE( ! isxdigit( 'g' ) );
    TESTCASE( isxdigit( 'A' ) );
    TESTCASE( isxdigit( 'F' ) );
    TESTCASE( ! isxdigit( 'G' ) );
    TESTCASE( ! isxdigit( '@' ) );
    TESTCASE( ! isxdigit( ' ' ) );
    return TEST_RESULTS;
}